

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isGatherOffsetsCompareResultValid
               (Texture2DArrayView *texture,Sampler *sampler,TexComparePrecision *prec,Vec3 *coord,
               IVec2 (*offsets) [4],float cmpReference,Vec4 *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec2 local_38;
  
  fVar6 = TexVerifierUtil::computeFloatingPointError(coord->m_data[2],*(int *)(prec + 8));
  fVar7 = TexVerifierUtil::computeFixedPointError(*(int *)(prec + 0x14));
  fVar9 = coord->m_data[2];
  fVar8 = floorf((fVar9 - (fVar7 + fVar6)) + 0.5);
  iVar2 = (int)fVar8;
  iVar4 = texture->m_numLevels;
  iVar5 = -1;
  iVar3 = iVar5;
  if (0 < iVar4) {
    iVar3 = (texture->m_levels->m_size).m_data[2] + -1;
  }
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  if (iVar2 < 0) {
    iVar3 = 0;
  }
  fVar9 = floorf(fVar7 + fVar6 + fVar9 + 0.5);
  iVar2 = (int)fVar9;
  if (0 < iVar4) {
    iVar5 = (texture->m_levels->m_size).m_data[2] + -1;
  }
  if (iVar2 < iVar5) {
    iVar5 = iVar2;
  }
  if (iVar2 < 0) {
    iVar5 = 0;
  }
  do {
    iVar4 = iVar3;
    if (iVar5 < iVar4) break;
    local_38.m_data = *(float (*) [2])coord->m_data;
    bVar1 = isGatherOffsetsCompareResultValid
                      (texture->m_levels,sampler,prec,&local_38,iVar4,offsets,cmpReference,result);
    iVar3 = iVar4 + 1;
  } while (!bVar1);
  return iVar4 <= iVar5;
}

Assistant:

bool isGatherOffsetsCompareResultValid (const Texture2DArrayView&	texture,
										const Sampler&				sampler,
										const TexComparePrecision&	prec,
										const Vec3&					coord,
										const IVec2					(&offsets)[4],
										float						cmpReference,
										const Vec4&					result)
{
	const float		depthErr	= computeFloatingPointError(coord.z(), prec.coordBits.z()) + computeFixedPointError(prec.uvwBits.z());
	const float		minZ		= coord.z()-depthErr;
	const float		maxZ		= coord.z()+depthErr;
	const int		minLayer	= de::clamp(deFloorFloatToInt32(minZ + 0.5f), 0, texture.getNumLayers()-1);
	const int		maxLayer	= de::clamp(deFloorFloatToInt32(maxZ + 0.5f), 0, texture.getNumLayers()-1);

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = minLayer; layer <= maxLayer; layer++)
	{
		if (isGatherOffsetsCompareResultValid(texture.getLevel(0), sampler, prec, coord.swizzle(0,1), layer, offsets, cmpReference, result))
			return true;
	}
	return false;
}